

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O0

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_texcoord
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VertexHandle _vh,
          Vec2f *_texcoord)

{
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this_00;
  bool bVar1;
  TexCoord2D local_38;
  BaseHandle local_24;
  VectorT<float,_2> *local_20;
  Vec2f *_texcoord_local;
  ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this_local;
  VertexHandle _vh_local;
  
  local_20 = _texcoord;
  _texcoord_local = (Vec2f *)this;
  this_local._4_4_ = _vh.super_BaseHandle.idx_;
  bVar1 = AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
          has_vertex_texcoords2D
                    ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      *)this->mesh_);
  if (bVar1) {
    this_00 = (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *
              )this->mesh_;
    local_24.idx_ = this_local._4_4_;
    local_38.super_VectorDataT<double,_2>.values_ =
         (VectorDataT<double,_2>)
         vector_cast<OpenMesh::VectorT<double,2>,OpenMesh::VectorT<float,2>>(local_20);
    AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
    set_texcoord2D(this_00,(VertexHandle)local_24.idx_,&local_38);
  }
  return;
}

Assistant:

virtual void set_texcoord(VertexHandle _vh, const Vec2f& _texcoord)
  {
    if (mesh_.has_vertex_texcoords2D())
      mesh_.set_texcoord2D(_vh, vector_cast<TexCoord2D>(_texcoord));
  }